

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O2

vector<long,_std::allocator<long>_> * __thiscall
anurbs::RTree<3l>::search<anurbs::RTree<3l>::PickByBox>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,void *this,PickByBox *check,
          Callback *callback)

{
  double *pdVar1;
  bool bVar2;
  runtime_error *this_00;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lStack_e0;
  Index index;
  Callback *local_c0;
  _Vector_base<long,_std::allocator<long>_> local_b8;
  long local_98;
  long local_90;
  Vector local_88;
  Vector local_68;
  Vector node_max;
  
  lVar3 = *(long *)((long)this + 0x58);
  local_c0 = callback;
  if (lVar3 != *(long *)((long)this + 0x68) - *(long *)((long)this + 0x60) >> 3) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Data not yet indexed - call RTree::finish().");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lStack_e0 = (*(long *)((long)this + 0x18) - *(long *)((long)this + 0x10) >> 3) + -1;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = lVar3 + -1;
  do {
    if (lVar3 < 0) {
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_b8);
      return __return_storage_ptr__;
    }
    lVar6 = *(long *)((long)this + 8) + lVar3;
    lVar5 = *(long *)(*(long *)((long)this + 0x10) + lStack_e0 * 8);
    if (lVar5 < lVar6) {
      lVar6 = lVar5;
    }
    local_98 = lStack_e0 + -1;
    lVar4 = lVar3 * 0x18;
    for (lVar5 = lVar3; lVar5 < lVar6; lVar5 = lVar5 + 1) {
      index = *(Index *)(*(long *)((long)this + 0x60) + lVar5 * 8);
      local_88.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [2] = *(double *)(*(long *)((long)this + 0x90) + 0x10 + lVar4);
      pdVar1 = (double *)(*(long *)((long)this + 0x90) + lVar4);
      local_88.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [0] = *pdVar1;
      local_88.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [1] = pdVar1[1];
      pdVar1 = (double *)(*(long *)((long)this + 0x78) + lVar4);
      local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [0] = *pdVar1;
      local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [1] = pdVar1[1];
      local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [2] = *(double *)(*(long *)((long)this + 0x78) + 0x10 + lVar4);
      node_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [0] = local_88.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
            array[0];
      node_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [1] = local_88.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
            array[1];
      node_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [2] = local_88.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
            array[2];
      bVar2 = RTree<3L>::PickByBox::operator()(check,&local_68,&local_88);
      if (bVar2) {
        if (lVar3 < *this) {
          if ((local_c0->super__Function_base)._M_manager != (_Manager_type)0x0) {
            bVar2 = std::function<bool_(long)>::operator()(local_c0,index);
            if (!bVar2) goto LAB_00198a3c;
          }
          std::vector<long,_std::allocator<long>_>::push_back(__return_storage_ptr__,&index);
        }
        else {
          std::vector<long,_std::allocator<long>_>::push_back
                    ((vector<long,_std::allocator<long>_> *)&local_b8,&index);
          local_90 = local_98;
          std::vector<long,_std::allocator<long>_>::emplace_back<long>
                    ((vector<long,_std::allocator<long>_> *)&local_b8,&local_90);
        }
      }
LAB_00198a3c:
      lVar4 = lVar4 + 0x18;
    }
    lStack_e0 = -1;
    lVar3 = lStack_e0;
    if (local_b8._M_impl.super__Vector_impl_data._M_start !=
        local_b8._M_impl.super__Vector_impl_data._M_finish) {
      lVar3 = local_b8._M_impl.super__Vector_impl_data._M_finish[-2];
      lStack_e0 = local_b8._M_impl.super__Vector_impl_data._M_finish[-1];
      local_b8._M_impl.super__Vector_impl_data._M_finish =
           local_b8._M_impl.super__Vector_impl_data._M_finish + -2;
    }
  } while( true );
}

Assistant:

std::vector<Index> search(const TCheck& check, Callback callback)
    {
        if (m_position != length(m_indices)) {
            throw std::runtime_error("Data not yet indexed - call RTree::finish().");
        }

        Index node_index = length(m_indices) - 1;
        Index level = length(m_level_bounds) - 1;
        std::vector<Index> queue;
        std::vector<Index> results;

        while (node_index > -1) {
            const Index end = std::min<Index>(node_index + m_node_size, m_level_bounds[level]);

            for (Index pos = node_index; pos < end; pos++) {
                const Index index = m_indices[pos];

                const Vector node_min = m_boxes_min[pos];
                const Vector node_max = m_boxes_max[pos];

                if (!check(node_min, node_max)) {
                    continue;
                }

                if (node_index < m_nb_items) {
                    if (callback == nullptr || callback(index)) {
                        results.push_back(index);
                    }
                } else {
                    queue.push_back(index);
                    queue.push_back(level - 1);
                }
            }

            if (queue.empty()) {
                node_index = -1;
                level = -1;
            } else {
                level = queue.back();
                queue.pop_back();
                node_index = queue.back();
                queue.pop_back();
            }
        }

        return results;
    }